

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O1

Iterator __thiscall ODDLParser::Value::Iterator::operator++(Iterator *this,int param_2)

{
  Value *pVVar1;
  undefined4 in_register_00000014;
  Iterator *inst;
  Value *in_RDI;
  Iterator IVar2;
  
  IVar2.m_current._4_4_ = in_register_00000014;
  IVar2.m_current._0_4_ = param_2;
  if (this->m_current == (Value *)0x0) {
    *(undefined8 *)in_RDI = ODDLParser::end;
    pVVar1 = DAT_008f5a30;
  }
  else {
    pVVar1 = this->m_current->m_next;
    this->m_current = pVVar1;
    *(Value **)in_RDI = pVVar1;
  }
  in_RDI->m_size = (size_t)pVVar1;
  IVar2.m_start = in_RDI;
  return IVar2;
}

Assistant:

const Value::Iterator Value::Iterator::operator++( int ) {
    if( ddl_nullptr == m_current ) {
        return end;
    }

    m_current = m_current->getNext();
    Iterator inst( m_current );

    return inst;
}